

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O2

void __thiscall cmCPackIFWPackage::DefaultConfiguration(cmCPackIFWPackage *this)

{
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->Description);
  std::__cxx11::string::assign((char *)&this->Version);
  std::__cxx11::string::assign((char *)&this->ReleaseDate);
  std::__cxx11::string::assign((char *)&this->Script);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this->Licenses);
  std::__cxx11::string::assign((char *)&this->SortingPriority);
  std::__cxx11::string::assign((char *)&this->Default);
  std::__cxx11::string::assign((char *)&this->Virtual);
  std::__cxx11::string::assign((char *)&this->ForcedInstallation);
  return;
}

Assistant:

void cmCPackIFWPackage::DefaultConfiguration()
{
  DisplayName = "";
  Description = "";
  Version = "";
  ReleaseDate = "";
  Script = "";
  Licenses.clear();
  SortingPriority = "";
  Default = "";
  Virtual = "";
  ForcedInstallation = "";
}